

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O3

void __thiscall
CChromeTracer::addCallLogging
          (CChromeTracer *this,char *name,string *tag,uint64_t threadId,uint64_t startTime,
          uint64_t delta)

{
  pointer pRVar1;
  int iVar2;
  undefined8 uVar3;
  char *local_40;
  RecordType local_34;
  
  local_40 = name;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if (this->m_BufferSize == 0) {
      writeCallLogging(this,name,(tag->_M_dataplus)._M_p,threadId,startTime,delta);
    }
    else {
      local_34 = CallLoggingTag;
      std::vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>>::
      emplace_back<CChromeTracer::RecordType,char_const*&,std::__cxx11::string_const&>
                ((vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>> *)
                 &this->m_RecordBuffer,&local_34,&local_40,tag);
      pRVar1 = (this->m_RecordBuffer).
               super__Vector_base<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pRVar1[-1].field_3.CallLogging.ThreadId = threadId;
      pRVar1[-1].field_3.CallLogging.StartTime = startTime;
      pRVar1[-1].field_3.CallLogging.Delta = delta;
      if ((ulong)this->m_BufferSize <=
          (ulong)(((long)(this->m_RecordBuffer).
                         super__Vector_base<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_RecordBuffer).
                         super__Vector_base<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111)) {
        flushRecords(this);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

void addCallLogging(
            const char* name,
            const std::string& tag,
            uint64_t threadId,
            uint64_t startTime,
            uint64_t delta )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        if( m_BufferSize == 0 )
        {
            writeCallLogging(
                name,
                tag.c_str(),
                threadId,
                startTime,
                delta );
        }
        else
        {
            m_RecordBuffer.emplace_back(RecordType::CallLoggingTag, name, tag);

            Record& rec = m_RecordBuffer.back();
            rec.CallLogging.ThreadId = threadId;
            rec.CallLogging.StartTime = startTime;
            rec.CallLogging.Delta = delta;

            checkFlushRecords();
        }
    }